

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.c
# Opt level: O0

char * flatcc_json_parser_finalize_unions
                 (flatcc_json_parser_t *ctx,char *buf,char *end,size_t handle)

{
  void *pvVar1;
  __flatcc_json_parser_union_frame_t *f;
  size_t handle_local;
  char *end_local;
  char *buf_local;
  flatcc_json_parser_t *ctx_local;
  
  pvVar1 = flatcc_builder_get_user_frame_ptr(ctx->ctx,handle);
  end_local = buf;
  if (*(long *)((long)pvVar1 + 8) != 0) {
    end_local = flatcc_json_parser_set_error(ctx,buf,end,0x1b);
  }
  flatcc_builder_exit_user_frame_at(ctx->ctx,handle);
  return end_local;
}

Assistant:

const char *flatcc_json_parser_finalize_unions(flatcc_json_parser_t *ctx,
        const char *buf, const char *end, size_t handle)
{
    __flatcc_json_parser_union_frame_t *f = flatcc_builder_get_user_frame_ptr(ctx->ctx, handle);

    if (f->union_count) {
        buf = flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_union_incomplete);
    }
    flatcc_builder_exit_user_frame_at(ctx->ctx, handle);
    return buf;
}